

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  long lVar1;
  Slice *this_00;
  int *piVar2;
  Status *rhs;
  undefined8 *in_RCX;
  size_t in_RDX;
  long in_RSI;
  string *in_RDI;
  void *in_R8;
  long in_FS_OFFSET;
  ssize_t read_size;
  Status *status;
  Status *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  string *context;
  undefined8 local_20;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  Status::Status(in_stack_ffffffffffffff68);
  do {
    this_00 = (Slice *)::read(*(int *)(in_RSI + 8),in_R8,in_RDX);
    if (-1 < (long)this_00) {
      Slice::Slice(this_00,in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      *in_RCX = local_20;
      in_RCX[1] = local_18;
      goto LAB_018cf81e;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  rhs = (Status *)(in_RSI + 0x10);
  __errno_location();
  PosixError(context,(int)((ulong)this_00 >> 0x20));
  Status::operator=((Status *)this_00,rhs);
  Status::~Status(in_stack_ffffffffffffff68);
LAB_018cf81e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }